

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.h
# Opt level: O1

void __thiscall cfd::core::ScriptOperator::~ScriptOperator(ScriptOperator *this)

{
  pointer pcVar1;
  
  this->_vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_0025a8b8;
  pcVar1 = (this->text_data_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->text_data_).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

virtual ~ScriptOperator() {
    // do nothing
  }